

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O3

void __thiscall hrvo::KdTree::build(KdTree *this)

{
  iterator __position;
  pointer pNVar1;
  iterator __position_00;
  pointer puVar2;
  pointer puVar3;
  Simulator *pSVar4;
  Node *pNVar5;
  ulong uVar6;
  long lVar7;
  size_type __n;
  ulong uVar8;
  bool bVar9;
  value_type local_48;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->agents_,
             (long)(this->simulator_->agents_).
                   super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->simulator_->agents_).
                   super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  uVar8 = (long)(this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_48.begin_ = (long)uVar8 >> 3;
  pSVar4 = this->simulator_;
  uVar6 = (long)(pSVar4->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar4->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < uVar6) {
    do {
      __position._M_current =
           (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert
                  (&this->agents_,__position,&local_48.begin_);
        pSVar4 = this->simulator_;
      }
      else {
        *__position._M_current = local_48.begin_;
        (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_48.begin_ = local_48.begin_ + 1;
      uVar6 = (long)(pSVar4->agents_).
                    super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pSVar4->agents_).
                    super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while (local_48.begin_ < (ulong)((long)uVar6 >> 3));
  }
  uVar6 = ((long)uVar6 >> 2) - 1;
  local_48.maxX_ = 0.0;
  local_48.maxY_ = 0.0;
  local_48.minX_ = 0.0;
  local_48.minY_ = 0.0;
  local_48.left_ = 0;
  local_48.right_ = 0;
  local_48.begin_ = 0;
  local_48.end_ = 0;
  pNVar1 = (this->nodes_).
           super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position_00._M_current =
       (this->nodes_).super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)__position_00._M_current - (long)pNVar1 >> 4;
  bVar9 = uVar6 < (ulong)(lVar7 * -0x5555555555555555);
  __n = uVar6 + lVar7 * 0x5555555555555555;
  if (bVar9 || __n == 0) {
    if ((bVar9) && (pNVar5 = pNVar1 + uVar6, __position_00._M_current != pNVar5)) {
      (this->nodes_).super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>.
      _M_impl.super__Vector_impl_data._M_finish = pNVar5;
    }
  }
  else {
    std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::_M_fill_insert
              (&this->nodes_,__position_00,__n,&local_48);
  }
  puVar2 = (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    buildRecursive(this,0,(long)puVar3 - (long)puVar2 >> 3,0);
  }
  return;
}

Assistant:

void KdTree::build() {
  agents_.reserve(simulator_->agents_.size());

  for (std::size_t i = agents_.size(); i < simulator_->agents_.size(); ++i) {
    agents_.push_back(i);
  }

  nodes_.resize(2U * simulator_->agents_.size() - 1U);

  if (!agents_.empty()) {
    buildRecursive(0U, agents_.size(), 0U);
  }
}